

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O2

void satoko_sort(void **data,uint size,_func_int_void_ptr_void_ptr *comp_fn)

{
  void *pvVar1;
  void *p1;
  void *p2;
  int iVar2;
  _func_int_void_ptr_void_ptr *comp_fn_00;
  uint uVar3;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  void **ppvVar8;
  ulong uVar9;
  uint size_00;
  long lVar10;
  ulong uVar4;
  
  uVar4 = (ulong)size;
  while( true ) {
    uVar7 = (uint)uVar4;
    if (uVar7 < 0x10) break;
    pvVar1 = data[uVar4 >> 1];
    lVar10 = -1;
    while( true ) {
      lVar10 = (long)(int)lVar10;
      ppvVar8 = data + lVar10;
      do {
        lVar10 = lVar10 + 1;
        p1 = ppvVar8[1];
        ppvVar8 = ppvVar8 + 1;
        iVar2 = clause_compare(p1,pvVar1);
      } while (iVar2 != 0);
      do {
        uVar3 = (int)uVar4 - 1;
        uVar4 = (ulong)uVar3;
        p2 = data[uVar4];
        iVar2 = clause_compare(pvVar1,p2);
      } while (iVar2 != 0);
      size_00 = (uint)lVar10;
      if (uVar3 <= size_00) break;
      *ppvVar8 = p2;
      data[uVar4] = p1;
    }
    satoko_sort(data,size_00,comp_fn_00);
    uVar4 = (ulong)(uVar7 - size_00);
    data = ppvVar8;
  }
  uVar3 = 1;
  for (uVar5 = 0; uVar5 != uVar7 - 1; uVar5 = uVar5 + 1) {
    uVar6 = uVar5 & 0xffffffff;
    for (uVar9 = (ulong)uVar3; uVar9 < uVar4; uVar9 = uVar9 + 1) {
      iVar2 = clause_compare(data[uVar9],data[uVar6]);
      if (iVar2 != 0) {
        uVar6 = uVar9 & 0xffffffff;
      }
    }
    pvVar1 = data[uVar5];
    data[uVar5] = data[uVar6];
    data[uVar6] = pvVar1;
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

static void satoko_sort(void **data, unsigned size,
            int (*comp_fn)(const void *, const void *))
{
    if (size <= 15)
        select_sort(data, size, comp_fn);
    else {
        void *pivot = data[size / 2];
        void *temp;
        unsigned j = size;
        int i = -1;

        for (;;) {
            do {
                i++;
            } while (comp_fn(data[i], pivot));
            do {
                j--;
            } while (comp_fn(pivot, data[j]));

            if ((unsigned) i >= j)
                break;

            temp = data[i];
            data[i] = data[j];
            data[j] = temp;
        }
        satoko_sort(data, (unsigned) i, comp_fn);
        satoko_sort(data + i, (size - (unsigned) i), comp_fn);
    }
}